

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O0

bool senjo::StringParam(string *name,string *value,char **params,bool *invalid)

{
  char *pcVar1;
  bool bVar2;
  char *begin;
  bool *invalid_local;
  char **params_local;
  string *value_local;
  string *name_local;
  
  bVar2 = ParamMatch(name,params);
  if (bVar2) {
    if ((*params == (char *)0x0) || (**params == '\0')) {
      *invalid = true;
    }
    else {
      pcVar1 = *params;
      NextSpace(params);
      std::__cxx11::string::assign((char *)value,(ulong)pcVar1);
      NextWord(params);
    }
    name_local._7_1_ = true;
  }
  else {
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

static inline bool StringParam(const std::string& name, std::string& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params) {
    invalid = true;
  }
  else {
    const char* begin = params;
    NextSpace(params);
    value.assign(begin, (params - begin));
    NextWord(params);
  }
  return true;
}